

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O1

void wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
     doVisitLocalSet(SpillPointers *self,Expression **currp)

{
  Index *__args_1;
  LocalSet *this;
  BasicBlock *pBVar1;
  Type type;
  bool bVar2;
  LocalGet *pLVar3;
  Drop *this_00;
  Block *pBVar4;
  LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this_01;
  Builder local_48;
  initializer_list<wasm::Expression_*> local_40;
  Expression *local_30;
  Expression **local_28;
  Expression **currp_local;
  
  this = (LocalSet *)*currp;
  local_28 = currp;
  if ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id == LocalSetId)
  {
    pBVar1 = (self->
             super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
             ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
             super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
             .currBasicBlock;
    if (pBVar1 == (BasicBlock *)0x0) {
      bVar2 = LocalSet::isTee(this);
      local_30 = this->value;
      if (bVar2) {
        type.id = (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
        ;
        if (type.id == (local_30->type).id) {
          *local_28 = local_30;
        }
        else {
          local_48.wasm =
               (self->
               super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
               ).
               super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
               .
               super_ControlFlowWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               .super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               currModule;
          local_40._M_array = &local_30;
          local_40._M_len = 1;
          pBVar4 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_48,&local_40,type);
          *local_28 = (Expression *)pBVar4;
        }
      }
      else {
        this_00 = (Drop *)MixedArena::allocSpace
                                    (&((self->
                                       super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                                       ).
                                       super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                       .
                                       super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                                       .
                                       super_ControlFlowWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                       .
                                       super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                       .
                                       super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                                      .currModule)->allocator,0x18,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        this_00->value = local_30;
        Drop::finalize(this_00);
        *local_28 = (Expression *)this_00;
      }
    }
    else {
      this_01 = &(self->
                 super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                 ).
                 super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
      ;
      local_40._M_array = (iterator)CONCAT44(local_40._M_array._4_4_,1);
      __args_1 = &this->index;
      std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
      emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
                ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
                 &(pBVar1->contents).actions,(What *)&local_40,__args_1,&local_28);
      pLVar3 = getCopy(this_01,this);
      if (pLVar3 != (LocalGet *)0x0) {
        addCopy(this_01,*__args_1,pLVar3->index);
        addCopy(this_01,*__args_1,pLVar3->index);
      }
    }
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
}

Assistant:

static void doVisitLocalSet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalSet>();
    // if in unreachable code, we don't need the tee (but might need the value,
    // if it has side effects)
    if (!self->currBasicBlock) {
      if (curr->isTee()) {
        // We can remove the tee, but must leave something of the exact same
        // type.
        auto originalType = curr->type;
        if (originalType != curr->value->type) {
          *currp =
            Builder(*self->getModule()).makeBlock({curr->value}, originalType);
        } else {
          // No special handling, just use the value.
          *currp = curr->value;
        }
      } else {
        *currp = Builder(*self->getModule()).makeDrop(curr->value);
      }
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Set, curr->index, currp);
    // if this is a copy, note it
    if (auto* get = self->getCopy(curr)) {
      // add 2 units, so that backedge prioritization can decide ties, but not
      // much more
      self->addCopy(curr->index, get->index);
      self->addCopy(curr->index, get->index);
    }
  }